

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Iff(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGia;
  int iVar1;
  uint fVerbose;
  char *pcVar2;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"vh"), iVar1 == 0x76) {
    fVerbose = fVerbose ^ 1;
  }
  if (iVar1 == -1) {
    pGia = pAbc->pGia;
    if (pGia == (Gia_Man_t *)0x0) {
      pcVar2 = "Abc_CommandAbc9Iff(): There is no AIG to map.\n";
    }
    else if (pGia->vMapping == (Vec_Int_t *)0x0) {
      pcVar2 = "Abc_CommandAbc9Iff(): Mapping of the AIG is not defined.\n";
    }
    else {
      if ((If_LibLut_t *)pAbc->pLibLut != (If_LibLut_t *)0x0) {
        Gia_ManIffTest(pGia,(If_LibLut_t *)pAbc->pLibLut,fVerbose);
        return 0;
      }
      pcVar2 = "Abc_CommandAbc9Iff(): LUT library is not defined.\n";
    }
    iVar1 = -1;
  }
  else {
    Abc_Print(-2,"usage: &iff [-vh]\n");
    Abc_Print(-2,"\t           performs structural mapping into LUT structures\n");
    pcVar2 = "yes";
    if (fVerbose == 0) {
      pcVar2 = "no";
    }
    Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar2);
    pcVar2 = "\t-h       : print the command usage\n";
    iVar1 = -2;
  }
  Abc_Print(iVar1,pcVar2);
  return 1;
}

Assistant:

int Abc_CommandAbc9Iff( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManIffTest( Gia_Man_t * pGia, If_LibLut_t * pLib, int fVerbose );
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Iff(): There is no AIG to map.\n" );
        return 1;
    }
    if ( !Gia_ManHasMapping(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Iff(): Mapping of the AIG is not defined.\n" );
        return 1;
    }
    if ( pAbc->pLibLut == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Iff(): LUT library is not defined.\n" );
        return 1;
    }
    Gia_ManIffTest( pAbc->pGia, (If_LibLut_t *)pAbc->pLibLut, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &iff [-vh]\n" );
    Abc_Print( -2, "\t           performs structural mapping into LUT structures\n" );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}